

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

void __thiscall
google::
sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::copy_from(sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *this,sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *ht,size_type min_buckets_wanted)

{
  int *piVar1;
  uint *puVar2;
  size_type sVar3;
  bool bVar4;
  size_type new_size;
  ulong uVar5;
  long lVar6;
  const_iterator it;
  const_iterator local_c0;
  const_iterator local_78;
  
  clear(this);
  new_size = sparsehash_internal::
             sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::
             min_buckets((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                          *)this,(ht->table).settings.num_buckets - ht->num_deleted,
                         min_buckets_wanted);
  if ((this->table).settings.table_size < new_size) {
    sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
    ::resize(&this->table,new_size);
    sparsehash_internal::
    sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::
    reset_thresholds((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                      *)this,(this->table).settings.table_size);
  }
  begin(&local_c0,ht);
  while( true ) {
    end(&local_78,ht);
    bVar4 = const_two_d_iterator<std::vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
            ::operator!=(&local_c0.pos,&local_78.pos);
    if (!bVar4) break;
    sVar3 = (this->table).settings.table_size;
    uVar5 = -(long)(local_c0.pos.col_current)->first;
    piVar1 = &(this->settings).
              super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
              super_TransparentHasher.super_Hasher.num_hashes_;
    *piVar1 = *piVar1 + 1;
    lVar6 = 0;
    while( true ) {
      uVar5 = uVar5 & sVar3 - 1;
      bVar4 = sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
              ::test(&this->table,uVar5);
      if (!bVar4) break;
      uVar5 = uVar5 + lVar6 + 1;
      lVar6 = lVar6 + 1;
    }
    sparsetable<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
    ::set(&this->table,uVar5,local_c0.pos.col_current);
    sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator++(&local_c0);
  }
  puVar2 = &(this->settings).
            super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>.
            num_ht_copies_;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void copy_from(const sparse_hashtable& ht, size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    const size_type resize_to =
        settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (const_iterator it = ht.begin(); it != ht.end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(*it)) & bucket_count_minus_one;
           table.test(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }